

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlkpp.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
pg::ZLKPPSolver::get_cur_nodes
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,ZLKPPSolver *this)

{
  int local_20;
  undefined1 local_19;
  int v;
  ZLKPPSolver *this_local;
  vector<int,_std::allocator<int>_> *ret;
  
  local_19 = 0;
  _v = this;
  this_local = (ZLKPPSolver *)__return_storage_ptr__;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  if (this->cur_num_nodes != 0) {
    local_20 = this->cur_first_node;
    do {
      std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&local_20);
      local_20 = this->cur_nodes_next[local_20];
    } while (local_20 != this->cur_first_node);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> ZLKPPSolver::get_cur_nodes() {
    std::vector<int> ret;
    if (cur_num_nodes) {
        int v = cur_first_node;
        for (;;) {
            ret.push_back(v);
            v = cur_nodes_next[v];
            if (v == cur_first_node)
                break;
        }
    }
    return ret;
}